

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::(anonymous_namespace)::Stack::
newFrame<jsonnet::internal::(anonymous_namespace)::FrameKind,jsonnet::internal::LocationRange>
          (Stack *this,FrameKind args,LocationRange *args_1)

{
  Frame *__last;
  pointer __first;
  _Tp_alloc_type *p_Var1;
  pointer __result;
  pointer pFVar2;
  _Tp_alloc_type *__alloc;
  undefined4 in_register_00000034;
  LocationRange *location;
  long lVar3;
  _Tp_alloc_type *this_00;
  
  location = (LocationRange *)CONCAT44(in_register_00000034,args);
  __last = *(Frame **)(this + 0x18);
  if (__last == *(Frame **)(this + 0x20)) {
    __first = *(pointer *)(this + 0x10);
    lVar3 = (long)__last - (long)__first;
    if (lVar3 == 0x7fffffffffffff30) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    __alloc = (_Tp_alloc_type *)((lVar3 >> 4) * -0x70a3d70a3d70a3d7);
    p_Var1 = (_Tp_alloc_type *)0x1;
    if (__last != __first) {
      p_Var1 = __alloc;
    }
    this_00 = p_Var1 + (long)__alloc;
    if ((_Tp_alloc_type *)0x51eb851eb851ea < this_00) {
      this_00 = (_Tp_alloc_type *)0x51eb851eb851eb;
    }
    if (CARRY8((ulong)p_Var1,(ulong)__alloc)) {
      this_00 = (_Tp_alloc_type *)0x51eb851eb851eb;
    }
    __result = std::
               _Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
               ::_M_allocate((_Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
                              *)this_00,(size_t)location);
    anon_unknown_0::Frame::Frame((Frame *)(lVar3 + (long)__result),(FrameKind *)0xc,location);
    pFVar2 = std::
             vector<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
             ::_S_relocate(__first,__last,__result,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first,*(long *)(this + 0x20) - (long)__first);
    }
    *(pointer *)(this + 0x10) = __result;
    *(pointer *)(this + 0x18) = pFVar2 + 1;
    *(pointer *)(this + 0x20) = __result + (long)this_00;
  }
  else {
    anon_unknown_0::Frame::Frame(__last,(FrameKind *)0xc,location);
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 400;
  }
  return;
}

Assistant:

void newFrame(Args... args)
    {
        stack.emplace_back(args...);
    }